

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

int __thiscall HighsCliqueTable::link(HighsCliqueTable *this,char *__from,char *__to)

{
  int *piVar1;
  CliqueVar CVar2;
  pointer pCVar3;
  pointer pCVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined8 local_8;
  
  iVar7 = (int)__from;
  iVar6 = (int)__to;
  local_8 = CONCAT44(iVar7,iVar6);
  pCVar3 = (this->cliqueentries).
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CVar2 = pCVar3[iVar7];
  piVar1 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0));
  *piVar1 = *piVar1 + 1;
  pCVar4 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  CVar2 = pCVar3[iVar7];
  uVar5 = (int)CVar2 << 1 | (uint)((int)CVar2 < 0);
  if (pCVar4[iVar6].end - pCVar4[iVar6].start == 2) {
    HighsHashTree<int,void>::insert<int&>
              ((HighsHashTree<int,void> *)
               ((this->invertedHashListSizeTwo).
                super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (int)uVar5),(int *)&local_8);
  }
  else {
    HighsHashTree<int,int>::insert<int&,int&>
              ((HighsHashTree<int,int> *)
               ((this->invertedHashList).
                super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (int)uVar5),(int *)&local_8,
               (int *)((long)&local_8 + 4));
  }
  return (int)local_8;
}

Assistant:

void HighsCliqueTable::link(HighsInt pos, HighsInt cliqueid) {
  assert(pos >= 0);
  assert(!colDeleted[cliqueentries[pos].col]);
  ++numcliquesvar[cliqueentries[pos].index()];

  HighsInt cliquelen = cliques[cliqueid].end - cliques[cliqueid].start;
  if (cliquelen == 2)
    invertedHashListSizeTwo[cliqueentries[pos].index()].insert(cliqueid);
  else
    invertedHashList[cliqueentries[pos].index()].insert(cliqueid, pos);
}